

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQueryConfigTests.cpp
# Opt level: O2

int __thiscall deqp::egl::GetConfigAttribCase::init(GetConfigAttribCase *this,EVP_PKEY_CTX *ctx)

{
  TestContext *this_00;
  int extraout_EAX;
  EGLDisplay pvVar1;
  Library *egl;
  _Vector_base<void_*,_std::allocator<void_*>_> _Stack_28;
  
  pvVar1 = eglu::getAndInitDisplay
                     ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                      super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                      .m_data.ptr,(Version *)0x0);
  this->m_display = pvVar1;
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  eglu::getConfigs((vector<void_*,_std::allocator<void_*>_> *)&_Stack_28,egl,this->m_display);
  std::vector<void_*,_std::allocator<void_*>_>::_M_move_assign(&this->m_configs);
  std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base(&_Stack_28);
  this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  (this->m_configsIter)._M_current =
       (this->m_configs).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,"Pass");
  return extraout_EAX;
}

Assistant:

void GetConfigAttribCase::init (void)
{
	DE_ASSERT(m_display == EGL_NO_DISPLAY);
	m_display		= eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());
	m_configs		= eglu::getConfigs(m_eglTestCtx.getLibrary(), m_display);
	m_configsIter	= m_configs.begin();

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
}